

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O2

int pcap_compile(pcap_t *p,bpf_program *program,char *buf,int optimize,bpf_u_int32 mask)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  YY_BUFFER_STATE b;
  bpf_insn *pbVar4;
  int *piVar5;
  char *pcVar6;
  yyscan_t scanner;
  char *xbuf;
  u_int len;
  undefined1 local_2f8 [404];
  undefined1 local_164 [16];
  undefined1 local_154 [16];
  undefined1 local_144 [16];
  int local_134;
  undefined8 auStack_128 [31];
  int local_30;
  
  scanner = (yyscan_t)0x0;
  xbuf = buf;
  if (p->activated == 0) {
    builtin_strncpy(p->errbuf,"not-yet-activated pcap_t passed to pcap_compile",0x30);
LAB_00108c1a:
    iVar1 = -1;
    goto LAB_00108c1d;
  }
  for (lVar3 = 0x1c8; lVar3 != 0x2c8; lVar3 = lVar3 + 0x10) {
    *(undefined1 (*) [16])(local_2f8 + lVar3) = (undefined1  [16])0x0;
  }
  local_30 = 0;
  local_2f8._244_4_ = 0;
  local_2f8._264_8_ = (addrinfo *)0x0;
  local_2f8._208_8_ = (block *)0x0;
  local_2f8._216_4_ = 0;
  local_2f8._388_16_ = (undefined1  [16])0x0;
  local_164 = (undefined1  [16])0x0;
  local_154 = (undefined1  [16])0x0;
  local_144 = (undefined1  [16])0x0;
  local_134 = 0;
  local_2f8._200_8_ = p;
  iVar1 = _setjmp((__jmp_buf_tag *)local_2f8);
  if (iVar1 != 0) {
    iVar1 = -1;
    if ((addrinfo *)local_2f8._264_8_ != (addrinfo *)0x0) {
      freeaddrinfo((addrinfo *)local_2f8._264_8_);
    }
    goto LAB_00108c1d;
  }
  local_2f8._240_4_ = mask;
  local_2f8._224_4_ = pcap_snapshot(p);
  if (local_2f8._224_4_ == 0) {
    builtin_strncpy(p->errbuf,"snaplen of 0 rejects all packets",0x21);
    goto LAB_00108c1a;
  }
  iVar1 = pcap_lex_init(&scanner);
  if (iVar1 != 0) {
    piVar5 = __errno_location();
    pcVar6 = pcap_strerror(*piVar5);
    bpf_error((compiler_state_t *)local_2f8,"can\'t initialize scanner: %s",pcVar6);
  }
  pcVar6 = xbuf;
  if (xbuf == (char *)0x0) {
    pcVar6 = "";
  }
  b = pcap__scan_string(pcVar6,scanner);
  pcap_set_extra((compiler_state_t *)local_2f8,scanner);
  local_2f8._256_4_ = p->fddipad;
  local_2f8._228_4_ = pcap_datalink(p);
  local_2f8._288_4_ = 0;
  local_2f8._292_4_ = -1;
  local_2f8._296_4_ = 0;
  local_2f8._300_4_ = 0;
  local_2f8._272_4_ = 0;
  local_2f8._276_4_ = 0;
  local_2f8._280_4_ = -1;
  local_2f8._284_4_ = 0;
  local_2f8._304_4_ = -1;
  local_2f8._308_8_ = 0;
  local_2f8._316_4_ = -1;
  local_2f8._320_8_ = 0;
  local_2f8._328_4_ = -1;
  local_2f8._332_4_ = 0;
  local_2f8._376_4_ = 0xffffffff;
  local_2f8._336_4_ = 0;
  local_2f8._340_4_ = 0xffffffff;
  local_2f8._344_4_ = 0xffffffff;
  local_2f8._348_4_ = 0xffffffff;
  local_2f8._368_4_ = 0xffffffff;
  local_2f8._372_4_ = 0xffffffff;
  local_2f8._352_4_ = 0xffffffff;
  local_2f8._356_4_ = 0xffffffff;
  local_2f8._360_4_ = 0xffffffff;
  local_2f8._364_4_ = 0xffffffff;
  local_2f8._248_4_ = 0;
  local_2f8._252_4_ = 0;
  local_2f8._380_4_ = 8;
  local_2f8._384_4_ = 3;
  local_2f8._232_4_ = local_2f8._228_4_;
  local_2f8._236_4_ = local_2f8._228_4_;
  switch(local_2f8._228_4_ - 0x68) {
  case 0:
  case 0x3e:
switchD_00108daf_caseD_0:
    local_2f8._320_8_ = 0x200000000;
  case 4:
switchD_00108daf_caseD_4:
    local_2f8._308_8_ = 0x400000000;
    goto LAB_001091d6;
  case 1:
    goto switchD_00108daf_caseD_1;
  case 2:
  case 6:
  case 7:
  case 8:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0x10:
  case 0x11:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x18:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
  case 0x3a:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x45:
  case 0x46:
  case 0x47:
  case 0x48:
  case 0x49:
  case 0x50:
  case 0x51:
  case 0x52:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x59:
  case 0x5b:
  case 0x5c:
  case 0x5e:
  case 0x5f:
  case 0x61:
    goto switchD_00108daf_caseD_2;
  case 3:
  case 10:
switchD_00108daf_caseD_3:
    local_2f8._320_8_ = -0x100000000;
    local_2f8._308_8_ = 0;
    goto LAB_001091d6;
  case 5:
    local_2f8._308_8_ = 0xc00000000;
    goto LAB_001091d6;
  case 9:
    lVar3 = 0xe;
LAB_00108ff4:
    local_2f8._320_8_ = lVar3 << 0x20;
    local_2f8._308_8_ = 0x1000000000;
    goto LAB_001091d6;
  case 0xf:
  case 0x17:
  case 0x3b:
    local_2f8._272_4_ = 1;
    local_2f8._276_4_ = 0;
    goto switchD_00108daf_caseD_1;
  case 0x12:
    uVar2 = 0x10;
    goto LAB_001090d1;
  case 0x13:
    local_2f8._328_4_ = -1;
    local_2f8._332_4_ = 1;
    local_2f8._340_4_ = 1;
    local_2f8._344_4_ = 2;
    local_2f8._348_4_ = 0;
    uVar2 = 4;
    local_2f8._376_4_ = uVar2;
    goto LAB_001090d1;
  case 0x19:
    local_2f8._320_8_ = 0x400000000;
LAB_001091cb:
    local_2f8._308_8_ = 0x800000000;
    goto LAB_001091d6;
  case 0x1a:
  case 0x1b:
  case 0x1e:
  case 0x4b:
  case 0x4c:
  case 0x4d:
    uVar2 = 4;
    goto LAB_00108db3;
  case 0x1c:
    local_2f8._320_8_ = 0x600000000;
    goto LAB_00109131;
  case 0x1d:
    local_2f8._320_8_ = 0x600000000;
    local_2f8._308_8_ = 0xc00000000;
    goto LAB_00108dc2;
  case 0x1f:
    uVar2 = 8;
    goto LAB_001090ea;
  case 0x20:
    local_2f8._320_8_ = 0xc00000000;
    goto LAB_00109131;
  case 0x21:
    uVar2 = 4;
LAB_001090ea:
    local_2f8._320_8_ = (ulong)uVar2 << 0x20;
    local_2f8._308_8_ = (ulong)uVar2 << 0x20;
    local_2f8._380_4_ = 0;
    local_2f8._384_4_ = 10;
    break;
  case 0x22:
    local_2f8._320_8_ = 0x1000000000;
    local_2f8._308_8_ = 0x1200000000;
LAB_001091d6:
    local_2f8._380_4_ = 0;
    local_2f8._384_4_ = 0;
    break;
  case 0x23:
    local_2f8._352_4_ = 6;
    local_2f8._356_4_ = 8;
    local_2f8._360_4_ = 7;
    local_2f8._364_4_ = 8;
    local_2f8._368_4_ = 8;
    local_2f8._372_4_ = 0xb;
    goto switchD_00108daf_caseD_3d;
  case 0x24:
    local_2f8._352_4_ = 2;
    local_2f8._356_4_ = 4;
    local_2f8._360_4_ = 3;
    local_2f8._364_4_ = 4;
    local_2f8._368_4_ = 4;
    local_2f8._372_4_ = 7;
    goto switchD_00108daf_caseD_3d;
  case 0x3c:
    uVar2 = 0xc;
LAB_00108db3:
    local_2f8._320_8_ = (ulong)uVar2 << 0x20;
    local_2f8._308_8_ = (ulong)uVar2 << 0x20;
    goto LAB_00108dc2;
  case 0x3d:
  case 0x62:
    goto switchD_00108daf_caseD_3d;
  case 0x3f:
  case 0x4a:
    local_2f8._308_8_ = 0xe00000000;
    local_2f8._320_8_ = 0x1000000000;
    local_2f8._380_4_ = 0x12;
    local_2f8._384_4_ = 0x15;
    break;
  case 0x40:
    local_2f8._320_8_ = 0x400000000;
    local_2f8._308_8_ = 0x600000000;
LAB_00108dc2:
    local_2f8._380_4_ = 0;
    local_2f8._384_4_ = 0xffffffff;
    break;
  case 0x4e:
    local_2f8._320_8_ = -0x100000000;
    local_2f8._308_8_ = 0;
    local_2f8._380_8_ = SUB168(ZEXT416(4),0);
    break;
  case 0x4f:
  case 0x60:
    local_2f8._320_8_ = 0x1200000000;
    goto LAB_00109131;
  case 0x58:
    local_2f8._320_8_ = 0x1800000000;
    local_2f8._308_8_ = 1;
    local_2f8._272_4_ = 1;
    local_2f8._276_4_ = 0;
    break;
  case 0x5a:
switchD_00108daf_caseD_5a:
    local_2f8._320_8_ = 0x800000000;
    goto LAB_00109131;
  case 0x5d:
    local_2f8._352_4_ = 0x16;
    local_2f8._356_4_ = 0x18;
    local_2f8._360_4_ = 0x17;
    local_2f8._364_4_ = 0x18;
    local_2f8._368_4_ = 0x18;
    local_2f8._372_4_ = 0x1b;
    goto switchD_00108daf_caseD_3d;
  default:
    switch(local_2f8._228_4_) {
    case 0:
      goto switchD_00108daf_caseD_4;
    case 1:
      local_2f8._320_8_ = 0xc00000000;
      local_2f8._308_8_ = 0xe00000000;
      goto LAB_001091b6;
    case 2:
    case 3:
    case 4:
    case 5:
    case 0xd:
    case 0xe:
    case 0x11:
    case 0x12:
      goto switchD_00108daf_caseD_2;
    case 6:
      uVar2 = 0xe;
      break;
    case 7:
      local_2f8._320_8_ = 0x200000000;
      local_2f8._308_8_ = 0x600000000;
      goto LAB_001091d6;
    case 8:
      lVar3 = 0xffffffff;
      goto LAB_00108ff4;
    case 9:
      goto switchD_00108daf_caseD_0;
    case 10:
      uVar2 = local_2f8._256_4_ + 0xd;
      break;
    case 0xb:
    case 0x13:
      goto switchD_00108e11_caseD_b;
    case 0xc:
      goto switchD_00108daf_caseD_3;
    case 0xf:
      lVar3 = 0xffffffff;
      goto LAB_00108f53;
    case 0x10:
      lVar3 = 5;
LAB_00108f53:
      local_2f8._320_8_ = lVar3 << 0x20;
      local_2f8._308_8_ = 0x1800000000;
      goto LAB_001091d6;
    default:
      switch(local_2f8._228_4_) {
      case 0xe2:
        local_2f8._320_8_ = 0x100000000;
        local_2f8._308_8_ = 0x1800000000;
        goto LAB_00108dc2;
      case 0xe4:
      case 0xe5:
        goto switchD_00108daf_caseD_3;
      case 0xe8:
      case 0xe9:
      case 0xea:
      case 0xee:
        goto switchD_00108daf_caseD_5a;
      case 0xf0:
        local_2f8._272_4_ = 0;
        local_2f8._276_4_ = 4;
        local_2f8._320_8_ = 0x1000000000;
        local_2f8._308_8_ = 0x1200000000;
        goto LAB_001091b6;
      case 0xf1:
        local_2f8._272_4_ = 0;
        local_2f8._276_4_ = 0xc;
        local_2f8._320_8_ = 0x1800000000;
        local_2f8._308_8_ = 0x1a00000000;
LAB_001091b6:
        local_2f8._380_4_ = 0;
        local_2f8._384_4_ = 3;
        goto switchD_00108e11_caseD_b;
      case 0xf6:
        local_2f8._320_8_ = -0x100000000;
        goto switchD_00108daf_caseD_4;
      default:
        if (local_2f8._228_4_ == 0x32) goto switchD_00108daf_caseD_0;
        if (local_2f8._228_4_ == 0x33) {
          local_2f8._320_8_ = 0x600000000;
          goto LAB_001091cb;
        }
        if (local_2f8._228_4_ == 99) {
          local_2f8._320_8_ = 0x600000000;
          local_2f8._308_8_ = 0x2c00000000;
          goto LAB_001091d6;
        }
      case 0xe3:
      case 0xe6:
      case 0xe7:
      case 0xeb:
      case 0xec:
      case 0xed:
      case 0xef:
      case 0xf2:
      case 0xf3:
      case 0xf4:
      case 0xf5:
switchD_00108daf_caseD_2:
        if (0xa0 < local_2f8._228_4_ - 0x68) {
          bpf_error((compiler_state_t *)local_2f8,"unknown data link type %d",
                    (ulong)(uint)local_2f8._228_4_);
        }
      }
      goto switchD_00108daf_caseD_3d;
    }
LAB_001090d1:
    local_2f8._320_8_ = (ulong)uVar2 << 0x20;
    local_2f8._308_8_ = (ulong)uVar2 << 0x20;
  }
switchD_00108e11_caseD_b:
  local_2f8._292_4_ = -1;
  local_2f8._284_4_ = (undefined4)local_2f8._272_8_;
  local_2f8._288_4_ = SUB84(local_2f8._272_8_,4);
  local_2f8._304_4_ = -1;
  local_2f8._296_8_ = local_2f8._272_8_;
  pcap_parse(scanner,(compiler_state_t *)local_2f8);
  if ((block *)local_2f8._208_8_ == (block *)0x0) {
    local_2f8._208_8_ = gen_retblk((compiler_state_t *)local_2f8,local_2f8._224_4_);
  }
  if (((optimize != 0) && (local_2f8._244_4_ == 0)) &&
     ((bpf_optimize((compiler_state_t *)local_2f8,(icode *)(local_2f8 + 0xd0)),
      (block *)local_2f8._208_8_ == (block *)0x0 ||
      ((((stmt *)(local_2f8._208_8_ + 0x10))->code == 6 &&
       (((stmt *)(local_2f8._208_8_ + 0x10))->k == 0)))))) {
    bpf_error((compiler_state_t *)local_2f8,"expression rejects all packets");
  }
  pbVar4 = icode_to_fcode((compiler_state_t *)local_2f8,(icode *)(local_2f8 + 0xd0),
                          (block *)local_2f8._208_8_,&len);
  program->bf_insns = pbVar4;
  program->bf_len = len;
  iVar1 = 0;
  if (b != (YY_BUFFER_STATE)0x0) {
    pcap__delete_buffer(b,scanner);
  }
LAB_00108c1d:
  if (scanner != (yyscan_t)0x0) {
    pcap_lex_destroy(scanner);
  }
  for (lVar3 = 0x1d0; lVar3 != 0x2d0; lVar3 = lVar3 + 0x10) {
    free(*(void **)(local_2f8 + lVar3));
  }
  return iVar1;
switchD_00108daf_caseD_3d:
  local_2f8._320_8_ = -0x100000000;
LAB_00109131:
  local_2f8._308_8_ = -0x100000000;
  local_2f8._380_4_ = 0xffffffff;
  local_2f8._384_4_ = 0xffffffff;
  goto switchD_00108e11_caseD_b;
switchD_00108daf_caseD_1:
  local_2f8._320_8_ = 0x1800000000;
  local_2f8._308_8_ = 1;
  goto switchD_00108e11_caseD_b;
}

Assistant:

int
pcap_compile(pcap_t *p, struct bpf_program *program,
	     const char *buf, int optimize, bpf_u_int32 mask)
{
	compiler_state_t cstate;
	const char * volatile xbuf = buf;
	yyscan_t scanner = NULL;
	YY_BUFFER_STATE in_buffer = NULL;
	u_int len;
	int  rc;

#ifdef _WIN32
	static int done = 0;

	if (!done)
		pcap_wsockinit();
	done = 1;
#endif

	/*
	 * If this pcap_t hasn't been activated, it doesn't have a
	 * link-layer type, so we can't use it.
	 */
	if (!p->activated) {
		pcap_snprintf(p->errbuf, PCAP_ERRBUF_SIZE,
		    "not-yet-activated pcap_t passed to pcap_compile");
		rc = -1;
		goto quit;
	}
	initchunks(&cstate);
	cstate.no_optimize = 0;
	cstate.ai = NULL;
	cstate.ic.root = NULL;
	cstate.ic.cur_mark = 0;
	cstate.bpf_pcap = p;
	init_regs(&cstate);

	if (setjmp(cstate.top_ctx)) {
#ifdef INET6
		if (cstate.ai != NULL)
			freeaddrinfo(cstate.ai);
#endif
		rc = -1;
		goto quit;
	}

	cstate.netmask = mask;

	cstate.snaplen = pcap_snapshot(p);
	if (cstate.snaplen == 0) {
		pcap_snprintf(p->errbuf, PCAP_ERRBUF_SIZE,
			 "snaplen of 0 rejects all packets");
		rc = -1;
		goto quit;
	}

	if (pcap_lex_init(&scanner) != 0)
		bpf_error(&cstate, "can't initialize scanner: %s", pcap_strerror(errno));
	in_buffer = pcap__scan_string(xbuf ? xbuf : "", scanner);

	/*
	 * Associate the compiler state with the lexical analyzer
	 * state.
	 */
	pcap_set_extra(&cstate, scanner);

	init_linktype(&cstate, p);
	(void)pcap_parse(scanner, &cstate);

	if (cstate.ic.root == NULL)
		cstate.ic.root = gen_retblk(&cstate, cstate.snaplen);

	if (optimize && !cstate.no_optimize) {
		bpf_optimize(&cstate, &cstate.ic);
		if (cstate.ic.root == NULL ||
		    (cstate.ic.root->s.code == (BPF_RET|BPF_K) && cstate.ic.root->s.k == 0))
			bpf_error(&cstate, "expression rejects all packets");
	}
	program->bf_insns = icode_to_fcode(&cstate, &cstate.ic, cstate.ic.root, &len);
	program->bf_len = len;

	rc = 0;  /* We're all okay */

quit:
	/*
	 * Clean up everything for the lexical analyzer.
	 */
	if (in_buffer != NULL)
		pcap__delete_buffer(in_buffer, scanner);
	if (scanner != NULL)
		pcap_lex_destroy(scanner);

	/*
	 * Clean up our own allocated memory.
	 */
	freechunks(&cstate);

	return (rc);
}